

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerReinterpretPrimitive(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  Opnd *this_01;
  Opnd *this_02;
  Opnd *dst;
  Opnd *src1;
  Instr *instr_local;
  Lowerer *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x529c,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_01 = IR::Instr::GetSrc1(instr);
  this_02 = IR::Instr::GetDst(instr);
  iVar3 = IR::Opnd::GetSize(this_02);
  iVar4 = IR::Opnd::GetSize(this_01);
  if (iVar3 != iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a0,"(dst->GetSize() == src1->GetSize())",
                       "dst->GetSize() == src1->GetSize()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Opnd::IsFloat32(this_02);
  if (((((!bVar2) || (bVar2 = IR::Opnd::IsInt32(this_01), !bVar2)) &&
       ((bVar2 = IR::Opnd::IsInt32(this_02), !bVar2 ||
        (bVar2 = IR::Opnd::IsFloat32(this_01), !bVar2)))) &&
      ((bVar2 = IR::Opnd::IsInt64(this_02), !bVar2 || (bVar2 = IR::Opnd::IsFloat64(this_01), !bVar2)
       ))) && ((bVar2 = IR::Opnd::IsFloat64(this_02), !bVar2 ||
               (bVar2 = IR::Opnd::IsInt64(this_01), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a4,
                       "((dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64()))"
                       ,
                       "(dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  LowererMD::EmitReinterpretPrimitive(&this->m_lowererMD,this_02,this_01,instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerReinterpretPrimitive(IR::Instr* instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* dst =  instr->GetDst();

    Assert(dst->GetSize() == src1->GetSize());
    Assert((dst->IsFloat32() && src1->IsInt32()) ||
           (dst->IsInt32() && src1->IsFloat32()) ||
           (dst->IsInt64() && src1->IsFloat64()) ||
           (dst->IsFloat64() && src1->IsInt64()) );

    m_lowererMD.EmitReinterpretPrimitive(dst, src1, instr);
    instr->Remove();
}